

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v10::detail::bigint::subtract_bigits(bigint *this,int index,bigit other,bigit *borrow)

{
  bigit *pbVar1;
  long lVar2;
  uint *in_RCX;
  uint in_EDX;
  bigint *in_RDI;
  double_bigit result;
  int in_stack_ffffffffffffffcc;
  
  pbVar1 = operator[](in_RDI,in_stack_ffffffffffffffcc);
  lVar2 = ((ulong)*pbVar1 - (ulong)in_EDX) - (ulong)*in_RCX;
  pbVar1 = operator[](in_RDI,in_stack_ffffffffffffffcc);
  *pbVar1 = (bigit)lVar2;
  *in_RCX = (uint)((ulong)lVar2 >> 0x3f);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_bigits(int index, bigit other, bigit& borrow) {
    auto result = static_cast<double_bigit>((*this)[index]) - other - borrow;
    (*this)[index] = static_cast<bigit>(result);
    borrow = static_cast<bigit>(result >> (bigit_bits * 2 - 1));
  }